

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglBufferAgeTests.cpp
# Opt level: O2

void deqp::egl::anon_unknown_0::clearColorReference(Surface *ref,Vec4 *clearColor)

{
  PixelBufferAccess PStack_38;
  
  tcu::Surface::getAccess(&PStack_38,ref);
  tcu::clear(&PStack_38,clearColor);
  return;
}

Assistant:

void clearColorReference (tcu::Surface* ref, const tcu::Vec4& clearColor)
{
	tcu::clear(ref->getAccess(), clearColor);
}